

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * translate(string *__return_storage_ptr__,rpc_conn conn,string *orignal)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  string *__range1;
  size_type sVar4;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             conn.super___weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar2 = __return_storage_ptr__->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    iVar3 = toupper((int)pcVar1[sVar4]);
    pcVar1[sVar4] = (char)iVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string translate(rpc_conn conn, const std::string &orignal) {
  std::string temp = orignal;
  for (auto &c : temp) {
    c = std::toupper(c);
  }
  return temp;
}